

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

char * __thiscall
spirv_cross::CompilerGLSL::flags_to_qualifiers_glsl(CompilerGLSL *this,SPIRType *type,Bitset *flags)

{
  bool bVar1;
  bool bVar2;
  SPIREntryPoint *pSVar3;
  bool bVar4;
  bool implied_ihighp;
  bool implied_fhighp;
  bool implied_imediump;
  bool implied_fmediump;
  SPIREntryPoint *execution;
  Bitset *flags_local;
  SPIRType *type_local;
  CompilerGLSL *this_local;
  
  bVar2 = Bitset::get(flags,0x14eb);
  if (bVar2) {
    this_local = (CompilerGLSL *)anon_var_dwarf_9730c;
  }
  else if (((((*(int *)&(type->super_IVariant).field_0xc == 0xd) ||
             (*(int *)&(type->super_IVariant).field_0xc == 7)) ||
            (*(int *)&(type->super_IVariant).field_0xc == 8)) ||
           ((*(int *)&(type->super_IVariant).field_0xc == 0x10 ||
            (*(int *)&(type->super_IVariant).field_0xc == 0x11)))) ||
          (*(int *)&(type->super_IVariant).field_0xc == 0x12)) {
    if (((this->options).es & 1U) == 0) {
      if (((this->backend).allow_precision_qualifiers & 1U) == 0) {
        this_local = (CompilerGLSL *)0x4d8596;
      }
      else {
        bVar2 = Bitset::get(flags,0);
        if (bVar2) {
          this_local = (CompilerGLSL *)anon_var_dwarf_9a92f;
        }
        else {
          this_local = (CompilerGLSL *)0x4d8596;
        }
      }
    }
    else {
      pSVar3 = Compiler::get_entry_point(&this->super_Compiler);
      bVar2 = Bitset::get(flags,0);
      if (bVar2) {
        bVar2 = false;
        if ((*(int *)&(type->super_IVariant).field_0xc == 0xd) &&
           (bVar2 = false, (this->options).fragment.default_float_precision == Mediump)) {
          bVar2 = pSVar3->model == ExecutionModelFragment;
        }
        if (((*(int *)&(type->super_IVariant).field_0xc == 7) ||
            (bVar4 = false, *(int *)&(type->super_IVariant).field_0xc == 8)) &&
           (bVar4 = false, (this->options).fragment.default_int_precision == Mediump)) {
          bVar4 = pSVar3->model == ExecutionModelFragment;
        }
        bVar1 = true;
        if (!bVar2) {
          bVar1 = bVar4;
        }
        this_local = (CompilerGLSL *)"mediump ";
        if (bVar1) {
          this_local = (CompilerGLSL *)0x4d8596;
        }
      }
      else {
        bVar2 = false;
        if ((*(int *)&(type->super_IVariant).field_0xc == 0xd) &&
           (((this->options).fragment.default_float_precision != Highp ||
            (bVar2 = true, pSVar3->model != ExecutionModelFragment)))) {
          bVar2 = pSVar3->model != ExecutionModelFragment;
        }
        if (((*(int *)&(type->super_IVariant).field_0xc == 7) ||
            (bVar4 = false, *(int *)&(type->super_IVariant).field_0xc == 8)) &&
           (((this->options).fragment.default_int_precision != Highp ||
            (bVar4 = true, pSVar3->model != ExecutionModelFragment)))) {
          bVar4 = pSVar3->model != ExecutionModelFragment;
        }
        bVar1 = true;
        if (!bVar2) {
          bVar1 = bVar4;
        }
        this_local = (CompilerGLSL *)"highp ";
        if (bVar1) {
          this_local = (CompilerGLSL *)0x4d8596;
        }
      }
    }
  }
  else {
    this_local = (CompilerGLSL *)0x4d8596;
  }
  return (char *)this_local;
}

Assistant:

const char *CompilerGLSL::flags_to_qualifiers_glsl(const SPIRType &type, const Bitset &flags)
{
	// GL_EXT_buffer_reference variables can be marked as restrict.
	if (flags.get(DecorationRestrictPointerEXT))
		return "restrict ";

	// Structs do not have precision qualifiers, neither do doubles (desktop only anyways, so no mediump/highp).
	if (type.basetype != SPIRType::Float && type.basetype != SPIRType::Int && type.basetype != SPIRType::UInt &&
	    type.basetype != SPIRType::Image && type.basetype != SPIRType::SampledImage &&
	    type.basetype != SPIRType::Sampler)
		return "";

	if (options.es)
	{
		auto &execution = get_entry_point();

		if (flags.get(DecorationRelaxedPrecision))
		{
			bool implied_fmediump = type.basetype == SPIRType::Float &&
			                        options.fragment.default_float_precision == Options::Mediump &&
			                        execution.model == ExecutionModelFragment;

			bool implied_imediump = (type.basetype == SPIRType::Int || type.basetype == SPIRType::UInt) &&
			                        options.fragment.default_int_precision == Options::Mediump &&
			                        execution.model == ExecutionModelFragment;

			return implied_fmediump || implied_imediump ? "" : "mediump ";
		}
		else
		{
			bool implied_fhighp =
			    type.basetype == SPIRType::Float && ((options.fragment.default_float_precision == Options::Highp &&
			                                          execution.model == ExecutionModelFragment) ||
			                                         (execution.model != ExecutionModelFragment));

			bool implied_ihighp = (type.basetype == SPIRType::Int || type.basetype == SPIRType::UInt) &&
			                      ((options.fragment.default_int_precision == Options::Highp &&
			                        execution.model == ExecutionModelFragment) ||
			                       (execution.model != ExecutionModelFragment));

			return implied_fhighp || implied_ihighp ? "" : "highp ";
		}
	}
	else if (backend.allow_precision_qualifiers)
	{
		// Vulkan GLSL supports precision qualifiers, even in desktop profiles, which is convenient.
		// The default is highp however, so only emit mediump in the rare case that a shader has these.
		if (flags.get(DecorationRelaxedPrecision))
			return "mediump ";
		else
			return "";
	}
	else
		return "";
}